

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O3

bool __thiscall
Diligent::anon_unknown_25::ArchiveSerializer<(Diligent::SerializerMode)0>::SerializeShaders
          (ArchiveSerializer<(Diligent::SerializerMode)0> *this,ShadersVector *Shaders)

{
  pointer pSVar1;
  bool bVar2;
  void *pData;
  SerializedData *Shader;
  pointer this_00;
  Uint32 NumShaders;
  void *Ptr;
  size_t Size;
  uint local_64;
  void *local_60;
  void *local_58;
  SerializedData local_50;
  
  local_64 = 0;
  bVar2 = Serializer<(Diligent::SerializerMode)0>::Copy<unsigned_int>(this->Ser,&local_64,4);
  if (bVar2) {
    std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::resize
              (Shaders,(ulong)local_64);
    this_00 = (Shaders->
              super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pSVar1 = (Shaders->
             super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    bVar2 = true;
    if (this_00 != pSVar1) {
      do {
        local_58 = (void *)0x0;
        local_60 = (void *)0x0;
        bVar2 = Serializer<(Diligent::SerializerMode)0>::SerializeBytes
                          (this->Ser,&local_60,(ConstQual<size_t> *)&local_58,8);
        if (!bVar2) goto LAB_00491bac;
        pData = local_58;
        if (local_58 != (void *)0x0) {
          pData = local_60;
        }
        SerializedData::SerializedData(&local_50,pData,(size_t)local_58);
        SerializedData::operator=(this_00,&local_50);
        SerializedData::~SerializedData(&local_50);
        this_00 = this_00 + 1;
      } while (this_00 != pSVar1);
      bVar2 = true;
    }
  }
  else {
LAB_00491bac:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ArchiveSerializer<SerializerMode::Read>::SerializeShaders(ShadersVector& Shaders) const
{
    Uint32 NumShaders = 0;
    if (!Ser(NumShaders))
        return false;

    Shaders.resize(NumShaders);
    for (auto& Shader : Shaders)
    {
        if (!Ser.Serialize(Shader))
            return false;
    }

    return true;
}